

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O1

iterator __thiscall
OpenMD::SectionParserManager::findSectionParser(SectionParserManager *this,string *sectionName)

{
  pointer __s2;
  _List_node_base *p_Var1;
  _List_node_base *__n;
  int iVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->sectionParsers_).
           super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->sectionParsers_) {
    __s2 = (sectionName->_M_dataplus)._M_p;
    p_Var1 = (_List_node_base *)sectionName->_M_string_length;
    do {
      __n = p_Var3[1]._M_prev[1]._M_next;
      if (__n == p_Var1) {
        if (__n == (_List_node_base *)0x0) {
          return (iterator)p_Var3;
        }
        iVar2 = bcmp((p_Var3[1]._M_prev)->_M_prev,__s2,(size_t)__n);
        if (iVar2 == 0) {
          return (iterator)p_Var3;
        }
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->sectionParsers_);
  }
  return (iterator)p_Var3;
}

Assistant:

SectionParserManager::iterator SectionParserManager::findSectionParser(
      const std::string& sectionName) {
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      if (i->sectionParser->getSectionName() == sectionName) { break; }
    }
    return i;
  }